

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  short *__src;
  undefined1 local_188 [8];
  gray_TWorker worker [1];
  FT_Bitmap *target_map;
  FT_Outline *outline;
  FT_Raster_Params *params_local;
  FT_Raster raster_local;
  
  __src = (short *)params->source;
  worker[0].render_span_data = params->target;
  if (raster == (FT_Raster)0x0) {
    raster_local._4_4_ = 6;
  }
  else if ((params->flags & 1U) == 0) {
    raster_local._4_4_ = 0x13;
  }
  else if (__src == (short *)0x0) {
    raster_local._4_4_ = 0x14;
  }
  else if ((__src[1] == 0) || (*__src < 1)) {
    raster_local._4_4_ = 0;
  }
  else if ((*(long *)(__src + 0xc) == 0) || (*(long *)(__src + 4) == 0)) {
    raster_local._4_4_ = 0x14;
  }
  else if ((int)__src[1] == *(short *)(*(long *)(__src + 0xc) + (long)(*__src + -1) * 2) + 1) {
    memcpy(&worker[0].y,__src,0x28);
    if ((params->flags & 2U) == 0) {
      if (worker[0].render_span_data == (void *)0x0) {
        return 6;
      }
      if ((*(int *)((long)worker[0].render_span_data + 4) == 0) ||
         (*worker[0].render_span_data == 0)) {
        return 0;
      }
      if (*(long *)((long)worker[0].render_span_data + 0x10) == 0) {
        return 6;
      }
      if (*(int *)((long)worker[0].render_span_data + 8) < 0) {
        worker[0].outline._32_8_ = *(undefined8 *)((long)worker[0].render_span_data + 0x10);
      }
      else {
        worker[0].outline._32_8_ =
             *(long *)((long)worker[0].render_span_data + 0x10) +
             (ulong)(uint)((*worker[0].render_span_data + -1) *
                          *(int *)((long)worker[0].render_span_data + 8));
      }
      worker[0].target.origin._0_4_ = *(undefined4 *)((long)worker[0].render_span_data + 8);
      worker[0].target.pitch = 0;
      worker[0].target._12_4_ = 0;
      worker[0].render_span = (FT_SpanFunc)0x0;
      worker[0].jump_buffer[0].__saved_mask.__val[0xf]._0_4_ = 0;
      worker[0].min_ex = 0;
      worker[0].jump_buffer[0].__saved_mask.__val[0xf]._4_4_ =
           *(int *)((long)worker[0].render_span_data + 4);
      worker[0].max_ex = *worker[0].render_span_data;
    }
    else {
      if (params->gray_spans == (FT_SpanFunc)0x0) {
        return 0;
      }
      worker[0].target._8_8_ = params->gray_spans;
      worker[0].render_span = (FT_SpanFunc)params->user;
      worker[0].jump_buffer[0].__saved_mask.__val[0xf]._0_4_ = (int)(params->clip_box).xMin;
      worker[0].min_ex = (TCoord)(params->clip_box).yMin;
      worker[0].jump_buffer[0].__saved_mask.__val[0xf]._4_4_ = (int)(params->clip_box).xMax;
      worker[0].max_ex = (TCoord)(params->clip_box).yMax;
    }
    if (((int)worker[0].jump_buffer[0].__saved_mask.__val[0xf] <
         worker[0].jump_buffer[0].__saved_mask.__val[0xf]._4_4_) &&
       (worker[0].min_ex < worker[0].max_ex)) {
      raster_local._4_4_ = gray_convert_glyph((gray_PWorker)local_188);
    }
    else {
      raster_local._4_4_ = 0;
    }
  }
  else {
    raster_local._4_4_ = 0x14;
  }
  return raster_local._4_4_;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Cannot_Render_Glyph );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return Smooth_Err_Ok;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return Smooth_Err_Ok;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;

      ras.min_ex = params->clip_box.xMin;
      ras.min_ey = params->clip_box.yMin;
      ras.max_ex = params->clip_box.xMax;
      ras.max_ey = params->clip_box.yMax;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return Smooth_Err_Ok;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;

      ras.min_ex = 0;
      ras.min_ey = 0;
      ras.max_ex = (FT_Pos)target_map->width;
      ras.max_ey = (FT_Pos)target_map->rows;
    }

    /* exit if nothing to do */
    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return Smooth_Err_Ok;

    return gray_convert_glyph( RAS_VAR );
  }